

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

int glfwGetError(char **description)

{
  long *in_RDI;
  int code;
  _GLFWerror *error;
  int local_14;
  _GLFWerror *local_10;
  
  local_14 = 0;
  if (in_RDI != (long *)0x0) {
    *in_RDI = 0;
  }
  if (_glfw.initialized == 0) {
    local_10 = &_glfwMainThreadError;
  }
  else {
    local_10 = (_GLFWerror *)_glfwPlatformGetTls((_GLFWtls *)0x534174);
  }
  if (local_10 != (_GLFWerror *)0x0) {
    local_14 = local_10->code;
    local_10->code = 0;
    if ((in_RDI != (long *)0x0) && (local_14 != 0)) {
      *in_RDI = (long)local_10->description;
    }
  }
  return local_14;
}

Assistant:

GLFWAPI int glfwGetError(const char** description)
{
    _GLFWerror* error;
    int code = GLFW_NO_ERROR;

    if (description)
        *description = NULL;

    if (_glfw.initialized)
        error = _glfwPlatformGetTls(&_glfw.errorSlot);
    else
        error = &_glfwMainThreadError;

    if (error)
    {
        code = error->code;
        error->code = GLFW_NO_ERROR;
        if (description && code)
            *description = error->description;
    }

    return code;
}